

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall
nuraft::rpc_session::read_complete(rpc_session *this,ptr<buffer> *hdr,ptr<buffer> *log_ctx)

{
  key *pkVar1;
  uint32_t uVar2;
  element_type *peVar3;
  pointer pcVar4;
  element_type *peVar5;
  asio_service_impl *paVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar7;
  unsigned_long this_01;
  byte bVar8;
  bool bVar9;
  int32 iVar10;
  int32 iVar11;
  int32_t iVar12;
  int iVar13;
  per_descriptor_data pdVar14;
  service_type *this_02;
  wait_op *pwVar15;
  void *pvVar16;
  element_type *peVar17;
  ulong size;
  ulong uVar18;
  log_val_type val_type;
  size_t meta_len;
  ConnectionArgs args;
  buffer_serializer ss;
  ulong term;
  ptr<rpc_session> self;
  string meta_str;
  uint64_t timestamp;
  log_val_type local_141;
  service_type *local_140;
  value_type local_138;
  undefined1 local_128 [8];
  element_type *peStack_120;
  undefined1 local_118 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_108;
  undefined8 uStack_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_e9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined4 local_cc;
  handler_type2 local_c8;
  unsigned_long local_a8;
  service_type *local_a0;
  ptr<resp_msg> local_98;
  ptr<req_msg> local_88;
  element_type *local_78;
  time_type local_70;
  undefined1 local_68 [16];
  __native_type local_58;
  
  std::__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::rpc_session,void>
            ((__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)this);
  buffer::pos((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,1);
  bVar8 = buffer::get_byte((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
  iVar10 = buffer::get_int((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
  iVar11 = buffer::get_int((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
  pdVar14 = (per_descriptor_data)
            buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  local_e0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
  local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar14;
  local_58.__data.__list.__prev =
       (__pthread_internal_list *)
       buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
  local_58._16_8_ =
       buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
  if (this->src_id_ == -1) {
    this->src_id_ = iVar10;
    invoke_connection_callback(this,true);
  }
  else if (this->is_leader_ == true) {
    peVar3 = (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((peVar3->leader_).super___atomic_base<int>._M_i != peVar3->id_) ||
       (iVar13 = -1, (peVar3->role_)._M_i == leader)) {
      iVar13 = (peVar3->leader_).super___atomic_base<int>._M_i;
    }
    if (this->src_id_ != iVar13) {
      this->is_leader_ = false;
    }
  }
  local_cc = iVar11;
  if (((this->is_leader_ == false) && (bVar8 < 0x1d)) && ((0x11015408U >> (bVar8 & 0x1f) & 1) != 0))
  {
    this->is_leader_ = true;
    local_128 = (undefined1  [8])this->session_id_;
    uVar2 = this->cached_port_;
    iVar11 = this->src_id_;
    peStack_120 = (element_type *)(local_118 + 8);
    pcVar4 = (this->cached_address_)._M_dataplus._M_p;
    local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)log_ctx;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&peStack_120,pcVar4,pcVar4 + (this->cached_address_)._M_string_length);
    uStack_100 = (asio_service_impl *)CONCAT44(iVar11,uVar2);
    local_f8._M_pi._0_1_ = 1;
    peVar3 = (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((peVar3->leader_).super___atomic_base<int>._M_i != peVar3->id_) ||
       (local_68._4_4_ = -1, (peVar3->role_)._M_i == leader)) {
      local_68._4_4_ = (peVar3->leader_).super___atomic_base<int>._M_i;
    }
    local_68._0_4_ = peVar3->id_;
    local_68._8_4_ = -1;
    local_58.__align = (long)local_128;
    raft_server::invoke_callback
              ((this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,NewSessionFromLeader,(Param *)local_68);
    log_ctx = (ptr<buffer> *)local_e8._M_pi;
    if (peStack_120 != (element_type *)(local_118 + 8)) {
      operator_delete(peStack_120);
    }
  }
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (wait_op *)0x0;
  local_58.__align = local_58.__align & 0xffffffffffffff00;
  this_02 = (service_type *)operator_new(0x60);
  (this_02->
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).
  super_service.key_.type_info_ = (type_info *)0x100000001;
  (this_02->
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).
  super_service._vptr_service = (_func_int **)&PTR___Sp_counted_ptr_inplace_006204e0;
  (this_02->
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).
  super_service.owner_ = (execution_context *)local_d8._M_pi;
  *(uint *)&(this_02->
            super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
            ).super_service.next_ = (uint)bVar8;
  *(int32 *)((long)&(this_02->
                    super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                    ).super_service.next_ + 4) = iVar10;
  *(undefined4 *)&(this_02->super_reactive_socket_service_base).reactor_ = local_cc;
  (this_02->
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).
  super_service.key_.id_ = (id *)&PTR__req_msg_00620530;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this_02->super_reactive_socket_service_base).success_ec_._M_value = local_e0._M_pi;
  (this_02->super_reactive_socket_service_base).success_ec_._M_cat =
       (error_category *)local_58.__data.__list.__prev;
  this_02[1].
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>.
  super_service._vptr_service = (_func_int **)local_58._16_8_;
  this_02[1].
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>.
  super_service.key_.type_info_ = (type_info *)0x0;
  this_02[1].
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>.
  super_service.key_.id_ = (id *)0x0;
  this_02[1].
  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>.
  super_service.owner_ = (execution_context *)0x0;
  local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
  iVar10 = buffer::get_int((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
  if ((iVar10 < 1) ||
     ((element_type *)
      (((service_type *)log_ctx)->
      super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).
      super_service._vptr_service == (element_type *)0x0)) {
LAB_00204574:
    paVar6 = this->impl_;
    if (((paVar6->my_opt_).read_req_meta_.super__Function_base._M_manager != (_Manager_type)0x0) &&
       (((wait_op *)local_68._8_8_ != (wait_op *)0x0 ||
        ((paVar6->my_opt_).invoke_req_cb_on_empty_meta_ == true)))) {
      uStack_100 = (asio_service_impl *)
                   this_02[1].
                   super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                   .super_service._vptr_service;
      local_118._0_8_ =
           (this_02->
           super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
           ).super_service.owner_;
      local_128 = (undefined1  [8])
                  (this_02->
                  super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                  ).super_service.next_;
      peStack_120 = (element_type *)
                    CONCAT44(peStack_120._4_4_,
                             *(undefined4 *)&(this_02->super_reactive_socket_service_base).reactor_)
      ;
      local_118._8_8_ =
           *(undefined8 *)&(this_02->super_reactive_socket_service_base).success_ec_._M_value;
      _Stack_108._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this_02->super_reactive_socket_service_base).success_ec_._M_cat;
      bVar9 = (*(paVar6->my_opt_).read_req_meta_._M_invoker)
                        ((_Any_data *)&(paVar6->my_opt_).read_req_meta_,
                         (asio_service_meta_cb_params *)local_128,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68);
      if (!bVar9) {
        stop(this);
        goto LAB_0020497e;
      }
    }
    peVar17 = (element_type *)(local_e8._M_pi + 1);
    _Stack_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uStack_100 = (asio_service_impl *)0x0;
    local_118._0_8_ = (element_type *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (undefined1  [8])0x0;
    peStack_120 = (element_type *)0x0;
    (*((this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_raft_server[2])(&local_138);
    if ((element_type *)local_118._0_8_ != (element_type *)0x0) {
      (*(code *)local_118._0_8_)(local_128,local_128,3);
    }
    if ((asio_service_impl *)
        local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (asio_service_impl *)0x0) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar13 = (*peVar5->_vptr_logger[7])(), 2 < iVar13)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_128,"no response is returned from raft message handler");
        (*peVar5->_vptr_logger[8])
                  (peVar5,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"read_complete",0x244,local_128);
        if (local_128 != (undefined1  [8])local_118) {
          operator_delete((void *)local_128);
        }
      }
      stop(this);
    }
    else {
      if (*(long *)((((steady_timer *)
                     ((long)local_138.
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + 0x40))->impl_).executor_.
                    super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                    .super_any_executor_base.object_.data + 8) == 0) {
        if ((((steady_timer *)
             ((long)local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 0x40))->impl_).implementation_.timer_data.heap_index_ != 0) {
          resp_msg::call_cb((resp_msg *)local_128,
                            (ptr<resp_msg> *)
                            local_138.
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           );
          peVar7 = peStack_120;
          local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_128;
          this_00._M_pi =
               local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          local_128 = (undefined1  [8])0x0;
          peStack_120 = (element_type *)0x0;
          local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
          }
          if (peStack_120 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_120);
          }
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          pkVar1 = &(this_02->
                    super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                    ).super_service.key_;
          *(int *)&pkVar1->type_info_ = *(int *)&pkVar1->type_info_ + 1;
          UNLOCK();
        }
        else {
          pkVar1 = &(this_02->
                    super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                    ).super_service.key_;
          *(int *)&pkVar1->type_info_ = *(int *)&pkVar1->type_info_ + 1;
        }
        local_98.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar17;
        local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
        on_resp_ready(this,&local_88,&local_98);
        local_a0 = (service_type *)
                   local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
        if (local_98.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          local_a0 = (service_type *)
                     local_88.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        }
      }
      else {
        (**(code **)((((steady_timer *)
                      ((long)local_138.
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 0x40))->impl_).executor_.
                     super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                     .super_any_executor_base.object_.data + 0x10))
                  (&local_a8,
                   &(((steady_timer *)
                     ((long)local_138.
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + 0x40))->impl_).implementation_.timer_data.prev_);
        this_01 = local_a8;
        peStack_120 = local_78;
        local_118._0_8_ = local_70.__d.__r;
        if (local_70.__d.__r != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_70.__d.__r + 8))->
                     _M_pi =
                 *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_70.__d.__r + 8))
                          ->_M_pi + 1;
            UNLOCK();
          }
          else {
            *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_70.__d.__r + 8))->
                     _M_pi =
                 *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_70.__d.__r + 8))
                          ->_M_pi + 1;
          }
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          pkVar1 = &(this_02->
                    super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                    ).super_service.key_;
          *(int *)&pkVar1->type_info_ = *(int *)&pkVar1->type_info_ + 1;
          UNLOCK();
        }
        else {
          pkVar1 = &(this_02->
                    super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                    ).super_service.key_;
          *(int *)&pkVar1->type_info_ = *(int *)&pkVar1->type_info_ + 1;
        }
        uStack_100 = (asio_service_impl *)
                     local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
        local_f8._M_pi =
             local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_128 = (undefined1  [8])this;
        local_118._8_8_ = peVar17;
        _Stack_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02;
        std::
        function<void(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)>
        ::
        function<nuraft::rpc_session::read_complete(std::shared_ptr<nuraft::buffer>,std::shared_ptr<nuraft::buffer>)::_lambda(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)_1_,void>
                  ((function<void(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)>
                    *)&local_c8,(anon_class_56_4_aa7ddfaa *)local_128);
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::when_ready
                  ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                   this_01,&local_c8);
        if ((wait_op *)local_c8.super__Function_base._M_manager != (wait_op *)0x0) {
          (*local_c8.super__Function_base._M_manager)(&local_c8,&local_c8,3);
        }
        if ((element_type *)local_f8._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
        }
        if ((service_type *)_Stack_108._M_pi != (service_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_108._M_pi);
        }
        if ((element_type *)local_118._0_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._0_8_);
        }
      }
      if (local_a0 != (service_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
      }
    }
    if (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    local_140 = this_02;
    buffer_serializer::buffer_serializer((buffer_serializer *)&local_c8,log_ctx,LITTLE);
    pwVar15 = (wait_op *)
              buffer::size((buffer *)
                           (((service_type *)log_ctx)->
                           super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                           ).super_service._vptr_service);
    if ((this->flags_ & 1) != 0) {
      local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pvVar16 = buffer_serializer::get_bytes((buffer_serializer *)&local_c8,(size_t *)&local_138);
      if ((asio_service_impl *)
          local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (asio_service_impl *)0x0) {
        local_128 = (undefined1  [8])local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,pvVar16,
                   (((steady_timer *)
                    ((long)local_138.
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 0x40))->impl_).executor_.
                   super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                   .super_any_executor_base.object_.data + (long)pvVar16 + -0x80);
        std::__cxx11::string::operator=((string *)local_68,(string *)local_128);
        if (local_128 != (undefined1  [8])local_118) {
          operator_delete((void *)local_128);
        }
      }
    }
    local_d8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((ulong)(((byte)this->flags_ & 4) >> 2) * 8 + 0xd);
    local_e0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &(((service_type *)(local_e8._M_pi + 4))->
          super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
          ).super_service.key_;
    do {
      this_02 = local_140;
      if (pwVar15 <= local_c8.super__Function_base._M_manager) goto LAB_00204574;
      if ((per_descriptor_data)((long)pwVar15 - (long)local_c8.super__Function_base._M_manager) <
          local_d8._M_pi) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar5 != (element_type *)0x0) && (iVar13 = (*peVar5->_vptr_logger[7])(), 2 < iVar13))
        {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_128,"wrong log ctx size %zu pos %zu, stop this session",pwVar15
                     ,local_c8.super__Function_base._M_manager);
          (*peVar5->_vptr_logger[8])
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"read_complete",0x21b,local_128);
          if (local_128 != (undefined1  [8])local_118) {
            operator_delete((void *)local_128);
          }
        }
        stop(this);
        this_02 = local_140;
        break;
      }
      local_a8 = buffer_serializer::get_u64((buffer_serializer *)&local_c8);
      local_141 = buffer_serializer::get_u8((buffer_serializer *)&local_c8);
      if ((this->flags_ & 4) == 0) {
        local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
      }
      else {
        local_58.__data.__list.__next =
             (__pthread_internal_list *)buffer_serializer::get_u64((buffer_serializer *)&local_c8);
      }
      iVar12 = buffer_serializer::get_i32((buffer_serializer *)&local_c8);
      size = (ulong)iVar12;
      uVar18 = (long)pwVar15 - (long)local_c8.super__Function_base._M_manager;
      if (uVar18 < size) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar5 != (element_type *)0x0) && (iVar13 = (*peVar5->_vptr_logger[7])(), 2 < iVar13))
        {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_128,"wrong value size %zu log ctx %zu %zu, stop this session",
                     size,pwVar15,local_c8.super__Function_base._M_manager);
          (*peVar5->_vptr_logger[8])
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"read_complete",0x228,(string *)local_128);
          if (local_128 != (undefined1  [8])local_118) {
            operator_delete((void *)local_128);
          }
        }
        stop(this);
      }
      else {
        buffer::alloc((buffer *)local_128,size);
        buffer_serializer::get_buffer((buffer_serializer *)&local_c8,(ptr<buffer> *)local_128);
        local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long&,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type&,unsigned_long&>
                  (&local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(log_entry **)&local_138,(allocator<nuraft::log_entry> *)&local_e9,
                   &local_a8,(shared_ptr<nuraft::buffer> *)local_128,&local_141,
                   (unsigned_long *)(local_58.__size + 0x20));
        std::
        vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
        ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     *)local_e0._M_pi,&local_138);
        if (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (peStack_120 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_120);
        }
      }
      this_02 = local_140;
    } while (size <= uVar18);
  }
LAB_0020497e:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  if ((prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
       *)local_68._0_8_ !=
      (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
       *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  if (local_70.__d.__r != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.__d.__r);
  }
  return;
}

Assistant:

void read_complete(ptr<buffer> hdr, ptr<buffer> log_ctx) {
        ptr<rpc_session> self = this->shared_from_this();

       try {
        hdr->pos(1);
        msg_type t = (msg_type)hdr->get_byte();
        int32 src = hdr->get_int();
        int32 dst = hdr->get_int();
        ulong term = hdr->get_ulong();
        ulong last_term = hdr->get_ulong();
        ulong last_idx = hdr->get_ulong();
        ulong commit_idx = hdr->get_ulong();

        if (src_id_ == -1) {
            // It means this is the first message on this session.
            // Invoke callback function of new connection.
            src_id_ = src;
            invoke_connection_callback(true);

        } else if (is_leader_ && src_id_ != handler_->get_leader()) {
            // Leader has been changed without closing session.
            is_leader_ = false;
        }

        if (!is_leader_) {
            // If leader flag is not set, we identify whether the endpoint
            // server is leader based on the message type (only leader
            // can send below message types).
            if ( t == msg_type::append_entries_request ||
                 t == msg_type::sync_log_request ||
                 t == msg_type::join_cluster_request ||
                 t == msg_type::leave_cluster_request ||
                 t == msg_type::install_snapshot_request ||
                 t == msg_type::priority_change_request ||
                 t == msg_type::custom_notification_request ) {
                is_leader_ = true;
                cb_func::ConnectionArgs
                    args( session_id_,
                          cached_address_,
                          cached_port_,
                          src_id_,
                          is_leader_ );
                cb_func::Param cb_param( handler_->get_id(),
                                         handler_->get_leader(),
                                         -1,
                                         &args );
                handler_->invoke_callback( cb_func::NewSessionFromLeader,
                                           &cb_param );
            }
        }

        std::string meta_str;
        ptr<req_msg> req = cs_new<req_msg>
                           ( term, t, src, dst, last_term, last_idx, commit_idx );
        if (hdr->get_int() > 0 && log_ctx) {
            buffer_serializer ss(log_ctx);
            size_t log_ctx_size = log_ctx->size();

            // If flag is set, read meta first.
            if (flags_ & INCLUDE_META) {
                size_t meta_len = 0;
                const byte* meta_raw = (const byte*)ss.get_bytes(meta_len);
                if (meta_len) {
                    meta_str = std::string((const char*)meta_raw, meta_len);
                }
            }

            size_t LOG_ENTRY_SIZE = 8 + 1 + 4;
            if (flags_ & INCLUDE_LOG_TIMESTAMP) {
                LOG_ENTRY_SIZE += 8;
            }

            while (log_ctx_size > ss.pos()) {
                if (log_ctx_size - ss.pos() < LOG_ENTRY_SIZE) {
                    // Possibly corrupted packet. Stop here.
                    p_wn("wrong log ctx size %zu pos %zu, stop this session",
                         log_ctx_size, ss.pos());
                    this->stop();
                    return;
                }
                ulong term = ss.get_u64();
                log_val_type val_type = (log_val_type)ss.get_u8();
                uint64_t timestamp = (flags_ & INCLUDE_LOG_TIMESTAMP) ? ss.get_u64() : 0;

                size_t val_size = ss.get_i32();
                if (log_ctx_size - ss.pos() < val_size) {
                    // Out-of-bound size.
                    p_wn("wrong value size %zu log ctx %zu %zu, "
                         "stop this session",
                         val_size, log_ctx_size, ss.pos());
                    this->stop();
                    return;
                }

                ptr<buffer> buf( buffer::alloc(val_size) );
                ss.get_buffer(buf);
                ptr<log_entry> entry(
                    cs_new<log_entry>(term, buf, val_type, timestamp) );
                req->log_entries().push_back(entry);
            }
        }

        // If callback is given, verify meta
        // (if meta is empty, invoke callback according to the flag).
        if ( impl_->get_options().read_req_meta_ &&
             ( !meta_str.empty() ||
               impl_->get_options().invoke_req_cb_on_empty_meta_ ) ) {
            if ( !impl_->get_options().read_req_meta_
                  ( req_to_params(req), meta_str ) ) {
                this->stop();
                return;
            }
        }

        // === RAFT server processes the request here. ===
        ptr<resp_msg> resp = raft_server_handler::process_req(handler_.get(), *req);
        if (!resp) {
            p_wn("no response is returned from raft message handler");
            this->stop();
            return;
        }

        if (resp->has_async_cb()) {
            // Response will be ready later, setup a callback function
            // (only for auto-forwarding with `client_request` type
            //  in async handling mode).
            ptr< cmd_result< ptr<buffer> > > ret = resp->call_async_cb();

            // WARNING: `self` should be captured to avoid releasing this `rpc_session`.
            ret->when_ready(
                [this, self, req, resp]
                ( cmd_result<ptr<buffer>, ptr<std::exception>>& res,
                  ptr<std::exception>& exp ) {
                    resp->set_ctx(res.get());
                    on_resp_ready(req, resp);
                    // This is needed to avoid circular reference.
                    res.reset();
                }
            );

        } else {
            // Response should already be ready when we reach here.
            if (resp->has_cb()) {
                // If callback function exists, get new response message.
                resp = resp->call_cb(resp);
            }
            on_resp_ready(req, resp);
        }

       } catch (std::exception& ex) {
        p_er( "session %" PRIu64 " failed to process request message "
              "due to error: %s",
              this->session_id_,
              ex.what() );
        this->stop();
       }
    }